

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O1

ggml_tensor * __thiscall test_soft_max::build_graph(test_soft_max *this,ggml_context *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  
  uVar1 = ggml_new_tensor(ctx,this->type,4,&this->ne);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_param(ctx,uVar1);
  ggml_set_name(uVar1,"a");
  if (this->mask == true) {
    uVar2 = ggml_new_tensor_2d(ctx,this->m_prec,(this->ne)._M_elems[0],(this->ne)._M_elems[1]);
    test_case::add_sentinel(&this->super_test_case,ctx);
    ggml_set_name(uVar2,"mask");
  }
  else {
    uVar2 = 0;
  }
  pgVar3 = (ggml_tensor *)ggml_soft_max_ext(this->scale,this->max_bias,ctx,uVar1,uVar2);
  ggml_set_name(pgVar3,"out");
  return pgVar3;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_param(ctx, a);
        ggml_set_name(a, "a");

        ggml_tensor * mask = nullptr;
        if (this->mask) {
            mask = ggml_new_tensor_2d(ctx, m_prec, ne[0], ne[1]);
            ggml_set_name(mask, "mask");
        }

        ggml_tensor * out = ggml_soft_max_ext(ctx, a, mask, scale, max_bias);
        ggml_set_name(out, "out");

        return out;
    }